

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

bool __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TryReadCodePointRest<false>
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,codepoint_t lower,
          EncodedCharPtr *startingLocation,EncodedCharPtr endOfSource,codepoint_t *outChar,
          bool *outContainsMultiUnitChar)

{
  bool *pbVar1;
  size_t sVar2;
  code *pcVar3;
  bool bVar4;
  char16 cVar5;
  codepoint_t cVar6;
  undefined4 *puVar7;
  bool *local_48;
  EncodedCharPtr *local_40;
  bool *local_38;
  
  local_40 = startingLocation;
  if (outChar == (codepoint_t *)0x0) {
    AssertCount = AssertCount + 1;
    local_38 = (bool *)endOfSource;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x14d,"(outChar != nullptr)","outChar != nullptr");
    if (!bVar4) goto LAB_00f04af9;
    *puVar7 = 0;
    endOfSource = local_38;
  }
  local_38 = outContainsMultiUnitChar;
  if (outContainsMultiUnitChar == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x14e,"(outContainsMultiUnitChar != nullptr)",
                       "outContainsMultiUnitChar != nullptr");
    if (!bVar4) goto LAB_00f04af9;
    *puVar7 = 0;
  }
  if (this->es6UnicodeMode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x14f,"(es6UnicodeMode)","es6UnicodeMode");
    if (!bVar4) goto LAB_00f04af9;
    *puVar7 = 0;
  }
  bVar4 = Js::NumberUtilities::IsSurrogateLowerPart(lower);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x150,"(Js::NumberUtilities::IsSurrogateLowerPart(lower))",
                       "Js::NumberUtilities::IsSurrogateLowerPart(lower)");
    if (!bVar4) {
LAB_00f04af9:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pbVar1 = (bool *)*local_40;
  *outChar = lower;
  if (pbVar1 < endOfSource) {
    sVar2 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
    local_48 = pbVar1 + 1;
    bVar4 = *pbVar1;
    cVar5 = (char16)bVar4;
    if (bVar4 < '\0') {
      cVar5 = utf8::DecodeTail((ushort)bVar4,&local_48,endOfSource,
                               &(this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions,
                               (bool *)0x0);
    }
    bVar4 = Js::NumberUtilities::IsSurrogateUpperPart((uint)(ushort)cVar5);
    if (bVar4) {
      cVar6 = Js::NumberUtilities::SurrogatePairAsCodePoint(lower,(uint)(ushort)cVar5);
      *outChar = cVar6;
      if (0x7f < (ushort)cVar5) {
        *local_38 = true;
      }
      *local_40 = local_48;
    }
    else {
      (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = sVar2;
    }
  }
  return true;
}

Assistant:

bool Scanner<EncodingPolicy>::TryReadCodePointRest(codepoint_t lower, EncodedCharPtr& startingLocation, EncodedCharPtr endOfSource, codepoint_t *outChar, bool *outContainsMultiUnitChar)

{
    Assert(outChar != nullptr);
    Assert(outContainsMultiUnitChar != nullptr);
    Assert(es6UnicodeMode);
    Assert(Js::NumberUtilities::IsSurrogateLowerPart(lower));

    EncodedCharPtr currentLocation = startingLocation;
    *outChar = lower;

    if (currentLocation < endOfSource)
    {
        size_t restorePoint = this->m_cMultiUnits;
        codepoint_t upper = this->template ReadFull<bScan>(currentLocation, endOfSource);

        if (Js::NumberUtilities::IsSurrogateUpperPart(upper))
        {
            *outChar = Js::NumberUtilities::SurrogatePairAsCodePoint(lower, upper);

            if (this->IsMultiUnitChar(static_cast<OLECHAR>(upper)))
            {
                *outContainsMultiUnitChar = true;
            }

            startingLocation = currentLocation;
        }
        else
        {
            this->RestoreMultiUnits(restorePoint);
        }
    }

    return true;
}